

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O3

bool helics::zeromq::bindzmqSocket
               (socket_t *socket,string *address,int port,milliseconds timeout,milliseconds period)

{
  socklen_t __len;
  sockaddr *__addr;
  string local_58;
  rep local_38;
  
  __len = (socklen_t)timeout.__r;
  local_38 = period.__r;
  gmlc::networking::makePortAddress(&local_58,address,port);
  zmq::detail::socket_base::bind
            (&socket->super_socket_base,(int)local_58._M_dataplus._M_p,__addr,__len);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool bindzmqSocket(zmq::socket_t& socket,
                   const std::string& address,
                   int port,
                   milliseconds timeout,
                   milliseconds period)
{
    bool bindsuccess = false;
    milliseconds tcount{0};
    while (!bindsuccess) {
        try {
            socket.bind(gmlc::networking::makePortAddress(address, port));
            bindsuccess = true;
        }
        catch ([[maybe_unused]] const zmq::error_t& ze) {
            if (tcount == milliseconds{0}) {
                // std::cerr << "zmq binding error on socket sleeping then will try again \n";
            }
            if (tcount > timeout) {
                break;
            }
            std::this_thread::sleep_for(period);
            tcount += period;
        }
    }
    return bindsuccess;
}